

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finitediff.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
fd::get_interior_coeffs
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,AccuracyOrder accuracy)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  invalid_argument *this;
  allocator<double> local_139;
  double local_138 [9];
  iterator local_f0;
  size_type local_e8;
  allocator<double> local_d9;
  double local_d8 [7];
  iterator local_a0;
  size_type local_98;
  allocator<double> local_89;
  double local_88 [5];
  iterator local_60;
  size_type local_58;
  allocator<double> local_39;
  double local_38 [2];
  iterator local_28;
  size_type local_20;
  AccuracyOrder local_14;
  vector<double,_std::allocator<double>_> *pvStack_10;
  AccuracyOrder accuracy_local;
  
  local_14 = accuracy;
  pvStack_10 = __return_storage_ptr__;
  switch(accuracy) {
  case SECOND:
    local_38[0] = 1.0;
    local_38[1] = -1.0;
    local_28 = local_38;
    local_20 = 2;
    std::allocator<double>::allocator(&local_39);
    __l_02._M_len = local_20;
    __l_02._M_array = local_28;
    std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l_02,&local_39);
    std::allocator<double>::~allocator(&local_39);
    break;
  case FOURTH:
    local_88[2] = 1.0;
    local_88[3] = 2.0;
    local_88[0] = -2.0;
    local_88[1] = -1.0;
    local_60 = local_88;
    local_58 = 4;
    std::allocator<double>::allocator(&local_89);
    __l_01._M_len = local_58;
    __l_01._M_array = local_60;
    std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l_01,&local_89);
    std::allocator<double>::~allocator(&local_89);
    break;
  case SIXTH:
    local_d8[4] = 2.0;
    local_d8[5] = 3.0;
    local_d8[2] = -1.0;
    local_d8[3] = 1.0;
    local_d8[0] = -3.0;
    local_d8[1] = -2.0;
    local_a0 = local_d8;
    local_98 = 6;
    std::allocator<double>::allocator(&local_d9);
    __l_00._M_len = local_98;
    __l_00._M_array = local_a0;
    std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l_00,&local_d9);
    std::allocator<double>::~allocator(&local_d9);
    break;
  case EIGHTH:
    local_138[6] = 3.0;
    local_138[7] = 4.0;
    local_138[4] = 1.0;
    local_138[5] = 2.0;
    local_138[2] = -2.0;
    local_138[3] = -1.0;
    local_138[0] = -4.0;
    local_138[1] = -3.0;
    local_f0 = local_138;
    local_e8 = 8;
    std::allocator<double>::allocator(&local_139);
    __l._M_len = local_e8;
    __l._M_array = local_f0;
    std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l,&local_139);
    std::allocator<double>::~allocator(&local_139);
    break;
  default:
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"invalid accuracy order");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> get_interior_coeffs(const AccuracyOrder accuracy)
{
    switch (accuracy) {
    case SECOND:
        return { { 1, -1 } };
    case FOURTH:
        return { { -2, -1, 1, 2 } };
    case SIXTH:
        return { { -3, -2, -1, 1, 2, 3 } };
    case EIGHTH:
        return { { -4, -3, -2, -1, 1, 2, 3, 4 } };
    default:
        throw std::invalid_argument("invalid accuracy order");
    }
}